

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

Float pbrt::SpectrumToPhotometric(SpectrumHandle *s)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 extraout_var [60];
  
  uVar1 = (s->
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          ).bits;
  if ((short)(uVar1 >> 0x30) == 4) {
    (s->
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    ).bits = *(ulong *)((uVar1 & 0xffffffffffff) + 0x20) | 0x2000000000000;
  }
  auVar7 = ZEXT816(0) << 0x40;
  iVar5 = 0x168;
  do {
    piVar2 = Spectra::y;
    lVar4 = lroundf((float)iVar5);
    uVar3 = (int)lVar4 - *piVar2;
    uVar6 = 0;
    if ((-1 < (int)uVar3) && ((ulong)uVar3 < *(ulong *)(piVar2 + 8))) {
      uVar6 = *(uint *)(*(long *)(piVar2 + 4) + (ulong)uVar3 * 4);
    }
    auVar8._0_4_ = SpectrumHandle::operator()(s,(float)iVar5);
    auVar8._4_60_ = extraout_var;
    iVar5 = iVar5 + 1;
    auVar7 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416(uVar6),ZEXT416(auVar7._0_4_));
  } while (iVar5 != 0x33f);
  return auVar7._0_4_ * 683.0;
}

Assistant:

Float SpectrumToPhotometric(SpectrumHandle s) {
    // We have to handle RGBSpectrum separately here as it's composed of an
    // illuminant spectrum and an RGB multiplier. We only want to consider the
    // illuminant for the sake of this calculation, and we should consider the
    // RGB separately for the purposes of target power/illuminance computation
    // in the lights themselves (but we currently don't)
    if (s.Is<RGBSpectrum>())
        s = s.Cast<RGBSpectrum>()->Illluminant();

    Float y = 0;
    for (Float lambda = Lambda_min; lambda <= Lambda_max; ++lambda)
        y += Spectra::Y()(lambda) * s(lambda);

    return y * K_m;
}